

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O2

unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_>
__thiscall
cppcms::impl::cgi::scgi_api_unix_socket_factory(cgi *this,service *srv,string *socket,int backlog)

{
  socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
  *this_00;
  string sStack_48;
  
  this_00 = (socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
             *)operator_new(0x68);
  std::__cxx11::string::string((string *)&sStack_48,(string *)socket);
  socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
  ::socket_acceptor(this_00,srv,&sStack_48,backlog);
  *(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
    **)this = this_00;
  std::__cxx11::string::~string((string *)&sStack_48);
  return (__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
          )(__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<acceptor> scgi_api_unix_socket_factory(cppcms::service &srv,std::string socket,int backlog)
	{
		std::unique_ptr<acceptor> a(new socket_acceptor<scgi>(srv,socket,backlog));
		return a;
	}